

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O3

QByteArray *
QStringAlgorithms<QByteArray>::simplified_helper(QByteArray *__return_storage_ptr__,QByteArray *str)

{
  byte bVar1;
  undefined1 *size;
  Data *pDVar2;
  byte *pbVar3;
  QTypedArrayData<char> *__old_val;
  byte *pbVar4;
  char *__old_val_1;
  byte *pbVar5;
  longlong __old_val_2;
  byte *pbVar6;
  long in_FS_OFFSET;
  QByteArray local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  size = (undefined1 *)(str->d).size;
  if (size == (undefined1 *)0x0) {
    pDVar2 = (str->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (str->d).ptr;
    (__return_storage_ptr__->d).size = 0;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    pbVar5 = (byte *)(str->d).ptr;
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    pDVar2 = (str->d).d;
    if ((pDVar2 == (Data *)0x0) ||
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
      QByteArray::QByteArray(&local_48,(qsizetype)size,Uninitialized);
    }
    else {
      (str->d).d = (Data *)0x0;
      (str->d).ptr = (char *)0x0;
      (str->d).size = 0;
      local_48.d.d = pDVar2;
      local_48.d.ptr = (char *)pbVar5;
      local_48.d.size = (qsizetype)size;
    }
    pbVar6 = pbVar5 + (long)size;
    pbVar4 = (byte *)local_48.d.ptr;
    do {
      while ((pbVar3 = pbVar4, 0x3f < *pbVar5 || ((1L << (*pbVar5 & 0x3f) & 0x100003e00U) == 0))) {
        while( true ) {
          pbVar4 = pbVar3;
          if (pbVar5 == pbVar6) goto LAB_00305247;
          bVar1 = *pbVar5;
          if ((bVar1 < 0x40) && ((1L << (bVar1 & 0x3f) & 0x100003e00U) != 0)) break;
          pbVar5 = pbVar5 + 1;
          *pbVar3 = bVar1;
          pbVar3 = pbVar3 + 1;
        }
        pbVar4 = pbVar3 + 1;
        *pbVar3 = 0x20;
        if (pbVar5 == pbVar6) {
          pbVar4 = pbVar3 + 1;
          goto LAB_00305247;
        }
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar6);
LAB_00305247:
    pbVar5 = (byte *)local_48.d.ptr;
    if ((pbVar4 != (byte *)local_48.d.ptr) && (pbVar5 = pbVar4 + -1, pbVar4[-1] != 0x20)) {
      pbVar5 = pbVar4;
    }
    QByteArray::resize(&local_48,(long)pbVar5 - (long)local_48.d.ptr);
    (__return_storage_ptr__->d).d = local_48.d.d;
    (__return_storage_ptr__->d).ptr = local_48.d.ptr;
    (__return_storage_ptr__->d).size = local_48.d.size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static inline StringType simplified_helper(StringType &str)
    {
        if (str.isEmpty())
            return str;
        const Char *src = str.cbegin();
        const Char *end = str.cend();
        NakedStringType result = isConst || !str.isDetached() ?
                                     StringType(str.size(), Qt::Uninitialized) :
                                     std::move(str);

        Char *dst = const_cast<Char *>(result.cbegin());
        Char *ptr = dst;
        bool unmodified = true;
        while (true) {
            while (src != end && isSpace(*src))
                ++src;
            while (src != end && !isSpace(*src))
                *ptr++ = *src++;
            if (src == end)
                break;
            if (*src != QChar::Space)
                unmodified = false;
            *ptr++ = QChar::Space;
        }
        if (ptr != dst && ptr[-1] == QChar::Space)
            --ptr;

        qsizetype newlen = ptr - dst;
        if (isConst && newlen == str.size() && unmodified) {
            // nothing happened, return the original
            return str;
        }
        result.resize(newlen);
        return result;
    }